

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WrittenFontCFF.cpp
# Opt level: O1

bool __thiscall
WrittenFontCFF::HasEnoughSpaceForGlyphs
          (WrittenFontCFF *this,GlyphUnicodeMappingListList *inGlyphsList)

{
  _Rb_tree_header *p_Var1;
  WrittenFontRepresentation *pWVar2;
  int iVar3;
  _List_node_base *p_Var4;
  _Rb_tree_color _Var5;
  _List_node_base *p_Var6;
  _Base_ptr p_Var7;
  _Base_ptr p_Var8;
  bool bVar9;
  
  p_Var4 = (inGlyphsList->
           super__List_base<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
           )._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var4 == (_List_node_base *)inGlyphsList) {
    iVar3 = 0;
  }
  else {
    pWVar2 = (this->super_AbstractWrittenFont).mANSIRepresentation;
    p_Var1 = &(pWVar2->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header;
    iVar3 = 0;
    do {
      p_Var6 = p_Var4[1]._M_next;
      if (p_Var6 != p_Var4 + 1) {
        do {
          _Var5 = (_Rb_tree_color)*(ushort *)((long)(p_Var6 + 2) + 8);
          p_Var7 = &p_Var1->_M_header;
          for (p_Var8 = (pWVar2->mGlyphIDToEncodedChar)._M_t._M_impl.super__Rb_tree_header._M_header
                        ._M_parent; (_Rb_tree_header *)p_Var8 != (_Rb_tree_header *)0x0;
              p_Var8 = (&p_Var8->_M_left)[bVar9]) {
            bVar9 = (_Rb_tree_color)*(size_t *)(p_Var8 + 1) < _Var5;
            if (!bVar9) {
              p_Var7 = p_Var8;
            }
          }
          p_Var8 = &p_Var1->_M_header;
          if (((_Rb_tree_header *)p_Var7 != p_Var1) && (p_Var8 = p_Var7, _Var5 < p_Var7[1]._M_color)
             ) {
            p_Var8 = &p_Var1->_M_header;
          }
          iVar3 = iVar3 + (uint)((_Rb_tree_header *)p_Var8 == p_Var1);
          p_Var6 = p_Var6->_M_next;
        } while (p_Var6 != p_Var4 + 1);
      }
      p_Var4 = (((_List_base<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>,_std::allocator<std::__cxx11::list<GlyphUnicodeMapping,_std::allocator<GlyphUnicodeMapping>_>_>_>
                  *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    } while (p_Var4 != (_List_node_base *)inGlyphsList);
  }
  return iVar3 <= (int)(uint)this->mAvailablePositionsCount;
}

Assistant:

bool WrittenFontCFF::HasEnoughSpaceForGlyphs(const GlyphUnicodeMappingListList& inGlyphsList)
{
	GlyphUnicodeMappingListList::const_iterator itList = inGlyphsList.begin();
	GlyphUnicodeMappingList::const_iterator it;
	int glyphsToAddCount = 0;

	for(; itList != inGlyphsList.end(); ++itList)
	{
		it = itList->begin();
		for(; it != itList->end(); ++it)
			if(mANSIRepresentation->mGlyphIDToEncodedChar.find(it->mGlyphCode) == mANSIRepresentation->mGlyphIDToEncodedChar.end())
				++glyphsToAddCount;
	}

	return glyphsToAddCount <= mAvailablePositionsCount;
}